

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O0

int __thiscall deqp::gls::MemoryStressCase::init(MemoryStressCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  CommandLine *this_00;
  undefined7 extraout_var;
  TestLog *this_01;
  MessageBuilder *this_02;
  NotSupportedError *this_03;
  allocator<char> local_1c1;
  string local_1c0;
  MessageBuilder local_190;
  MemoryStressCase *local_10;
  MemoryStressCase *this_local;
  
  local_10 = this;
  this_00 = tcu::TestContext::getCommandLine((this->super_TestCase).super_TestNode.m_testCtx);
  bVar1 = tcu::CommandLine::isOutOfMemoryTestEnabled(this_00);
  if (!bVar1) {
    this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_190,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    this_02 = tcu::MessageBuilder::operator<<
                        (&local_190,
                         (char (*) [98])
                         "Tests that exhaust memory are disabled, use --deqp-test-oom=enable command line option to enable."
                        );
    tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_190);
    this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"OOM tests disabled",&local_1c1);
    tcu::NotSupportedError::NotSupportedError(this_03,&local_1c0);
    __cxa_throw(this_03,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void MemoryStressCase::init (void)
{
	if (!m_testCtx.getCommandLine().isOutOfMemoryTestEnabled())
	{
		m_testCtx.getLog() << TestLog::Message << "Tests that exhaust memory are disabled, use --deqp-test-oom=enable command line option to enable." << TestLog::EndMessage;
		throw tcu::NotSupportedError("OOM tests disabled");
	}
}